

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

SharedPluralRules * __thiscall
icu_63::LocaleCacheKey<icu_63::SharedPluralRules>::createObject
          (LocaleCacheKey<icu_63::SharedPluralRules> *this,void *param_1,UErrorCode *status)

{
  UBool UVar1;
  PluralRules *pPVar2;
  SharedPluralRules *pSVar3;
  SharedPluralRules *local_168;
  LocalPointerBase<icu_63::SharedPluralRules> local_130;
  LocalPointer<icu_63::SharedPluralRules> result;
  Locale local_118;
  LocalPointerBase<icu_63::PluralRules> local_38;
  LocalPointer<icu_63::PluralRules> pr;
  char *localeId;
  UErrorCode *status_local;
  void *param_1_local;
  LocaleCacheKey<icu_63::SharedPluralRules> *this_local;
  
  pr.super_LocalPointerBase<icu_63::PluralRules>.ptr =
       (LocalPointerBase<icu_63::PluralRules>)Locale::getName(&this->fLoc);
  Locale::Locale(&local_118,(char *)pr.super_LocalPointerBase<icu_63::PluralRules>.ptr,(char *)0x0,
                 (char *)0x0,(char *)0x0);
  pPVar2 = PluralRules::internalForLocale(&local_118,UPLURAL_TYPE_CARDINAL,status);
  LocalPointer<icu_63::PluralRules>::LocalPointer
            ((LocalPointer<icu_63::PluralRules> *)&local_38,pPVar2,status);
  Locale::~Locale(&local_118);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pSVar3 = (SharedPluralRules *)UMemory::operator_new((UMemory *)0x20,(size_t)pPVar2);
    local_168 = (SharedPluralRules *)0x0;
    if (pSVar3 != (SharedPluralRules *)0x0) {
      pPVar2 = LocalPointerBase<icu_63::PluralRules>::getAlias(&local_38);
      SharedPluralRules::SharedPluralRules(pSVar3,pPVar2);
      local_168 = pSVar3;
    }
    LocalPointer<icu_63::SharedPluralRules>::LocalPointer
              ((LocalPointer<icu_63::SharedPluralRules> *)&local_130,local_168,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      LocalPointerBase<icu_63::PluralRules>::orphan(&local_38);
      pSVar3 = LocalPointerBase<icu_63::SharedPluralRules>::operator->(&local_130);
      SharedObject::addRef(&pSVar3->super_SharedObject);
      this_local = (LocaleCacheKey<icu_63::SharedPluralRules> *)
                   LocalPointerBase<icu_63::SharedPluralRules>::orphan(&local_130);
    }
    else {
      this_local = (LocaleCacheKey<icu_63::SharedPluralRules> *)0x0;
    }
    result.super_LocalPointerBase<icu_63::SharedPluralRules>.ptr._0_4_ = 1;
    LocalPointer<icu_63::SharedPluralRules>::~LocalPointer
              ((LocalPointer<icu_63::SharedPluralRules> *)&local_130);
  }
  else {
    this_local = (LocaleCacheKey<icu_63::SharedPluralRules> *)0x0;
    result.super_LocalPointerBase<icu_63::SharedPluralRules>.ptr._0_4_ = 1;
  }
  LocalPointer<icu_63::PluralRules>::~LocalPointer((LocalPointer<icu_63::PluralRules> *)&local_38);
  return (SharedPluralRules *)this_local;
}

Assistant:

U_I18N_API
const SharedPluralRules *LocaleCacheKey<SharedPluralRules>::createObject(
        const void * /*unused*/, UErrorCode &status) const {
    const char *localeId = fLoc.getName();
    LocalPointer<PluralRules> pr(PluralRules::internalForLocale(localeId, UPLURAL_TYPE_CARDINAL, status), status);
    if (U_FAILURE(status)) {
        return nullptr;
    }
    LocalPointer<SharedPluralRules> result(new SharedPluralRules(pr.getAlias()), status);
    if (U_FAILURE(status)) {
        return nullptr;
    }
    pr.orphan(); // result was successfully created so it nows pr.
    result->addRef();
    return result.orphan();
}